

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_string_delete_property(JSContext *ctx,JSValue obj,JSAtom prop)

{
  int iVar1;
  
  if (((-1 < (int)prop) || (*(int *)((long)obj.u.ptr + 0x38) != -7)) ||
     (iVar1 = 0,
     (*(uint *)(*(long *)((long)obj.u.ptr + 0x30) + 4) & 0x7fffffff) <= (prop & 0x7fffffff))) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int js_string_delete_property(JSContext *ctx,
                                     JSValueConst obj, JSAtom prop)
{
    uint32_t idx;

    if (__JS_AtomIsTaggedInt(prop)) {
        idx = __JS_AtomToUInt32(prop);
        if (idx < js_string_obj_get_length(ctx, obj)) {
            return FALSE;
        }
    }
    return TRUE;
}